

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_parse_result *
pugi::impl::anon_unknown_0::load_buffer_impl
          (xml_parse_result *__return_storage_ptr__,xml_document_struct *doc,xml_node_struct *root,
          void *contents,size_t size,uint options,xml_encoding encoding,bool is_mutable,bool own,
          char_t **out_buffer)

{
  bool bVar1;
  size_t local_48;
  size_t length;
  char_t *buffer;
  byte local_2e;
  byte local_2d;
  xml_encoding buffer_encoding;
  bool own_local;
  bool is_mutable_local;
  size_t sStack_28;
  uint options_local;
  size_t size_local;
  void *contents_local;
  xml_node_struct *root_local;
  xml_document_struct *doc_local;
  
  local_2d = is_mutable;
  local_2e = own;
  buffer_encoding = options;
  sStack_28 = size;
  size_local = (size_t)contents;
  contents_local = root;
  root_local = &doc->super_xml_node_struct;
  if ((contents == (void *)0x0) && (size != 0)) {
    make_parse_result(__return_storage_ptr__,status_io_error,0);
  }
  else {
    buffer._4_4_ = get_buffer_encoding(encoding,contents,size);
    length = 0;
    local_48 = 0;
    bVar1 = convert_buffer((char_t **)&length,&local_48,buffer._4_4_,(void *)size_local,sStack_28,
                           (bool)(local_2d & 1));
    if (bVar1) {
      if ((((local_2e & 1) != 0) && (length != size_local)) && (size_local != 0)) {
        (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
                  (size_local);
      }
      if (((local_2e & 1) != 0) || (length != size_local)) {
        *out_buffer = (char_t *)length;
      }
      root_local[1].value = (char_t *)length;
      xml_parser::parse(__return_storage_ptr__,(char_t *)length,local_48,
                        (xml_document_struct *)root_local,(xml_node_struct *)contents_local,
                        buffer_encoding);
      __return_storage_ptr__->encoding = buffer._4_4_;
    }
    else {
      make_parse_result(__return_storage_ptr__,status_out_of_memory,0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

PUGI__FN xml_parse_result load_buffer_impl(xml_document_struct* doc, xml_node_struct* root, void* contents, size_t size, unsigned int options, xml_encoding encoding, bool is_mutable, bool own, char_t** out_buffer)
	{
		// check input buffer
		if (!contents && size) return make_parse_result(status_io_error);

		// get actual encoding
		xml_encoding buffer_encoding = impl::get_buffer_encoding(encoding, contents, size);

		// get private buffer
		char_t* buffer = 0;
		size_t length = 0;

		// coverity[var_deref_model]
		if (!impl::convert_buffer(buffer, length, buffer_encoding, contents, size, is_mutable)) return impl::make_parse_result(status_out_of_memory);

		// delete original buffer if we performed a conversion
		if (own && buffer != contents && contents) impl::xml_memory::deallocate(contents);

		// grab onto buffer if it's our buffer, user is responsible for deallocating contents himself
		if (own || buffer != contents) *out_buffer = buffer;

		// store buffer for offset_debug
		doc->buffer = buffer;

		// parse
		xml_parse_result res = impl::xml_parser::parse(buffer, length, doc, root, options);

		// remember encoding
		res.encoding = buffer_encoding;

		return res;
	}